

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Module::ToBinary
          (Module *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary,bool skip_nop)

{
  uint uVar1;
  size_type sVar2;
  uint *puVar3;
  function<void_(const_spvtools::opt::Instruction_*)> local_98;
  undefined1 local_78 [8];
  anon_class_56_7_b8c52d77 write_inst;
  uint32_t uStack_38;
  bool between_label_and_phi_var;
  uint32_t uStack_34;
  bool between_merge_and_branch;
  Instruction *last_line_inst;
  DebugScope last_scope;
  size_t bound_idx;
  bool skip_nop_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binary_local;
  Module *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(binary,(value_type *)this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).version);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).generator);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(binary,&(this->header_).bound)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (binary,&(this->header_).schema);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(binary);
  last_scope = (DebugScope)(sVar2 - 2);
  DebugScope::DebugScope((DebugScope *)&last_line_inst,0,0);
  uStack_38 = 0;
  uStack_34 = 0;
  write_inst.this._7_1_ = 0;
  write_inst.this._6_1_ = 0;
  write_inst._8_8_ = &last_line_inst;
  write_inst.last_scope = (DebugScope *)&stack0xffffffffffffffc8;
  write_inst.last_line_inst = (Instruction **)((long)&write_inst.this + 7);
  write_inst.between_merge_and_branch = (bool *)((long)&write_inst.this + 6);
  local_78 = (undefined1  [8])binary;
  write_inst.binary._0_1_ = skip_nop;
  write_inst.between_label_and_phi_var = (bool *)this;
  std::function<void(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::Module::ToBinary(std::vector<unsigned_int,std::allocator<unsigned_int>>*,bool)const::__0&,void>
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_98,
             (anon_class_56_7_b8c52d77 *)local_78);
  ForEachInst(this,&local_98,true);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_98);
  uVar1 = (this->header_).bound;
  puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(binary);
  puVar3[(long)last_scope] = uVar1;
  return;
}

Assistant:

void Module::ToBinary(std::vector<uint32_t>* binary, bool skip_nop) const {
  binary->push_back(header_.magic_number);
  binary->push_back(header_.version);
  // TODO(antiagainst): should we change the generator number?
  binary->push_back(header_.generator);
  binary->push_back(header_.bound);
  binary->push_back(header_.schema);

  size_t bound_idx = binary->size() - 2;
  DebugScope last_scope(kNoDebugScope, kNoInlinedAt);
  const Instruction* last_line_inst = nullptr;
  bool between_merge_and_branch = false;
  bool between_label_and_phi_var = false;
  auto write_inst = [binary, skip_nop, &last_scope, &last_line_inst,
                     &between_merge_and_branch, &between_label_and_phi_var,
                     this](const Instruction* i) {
    // Skip emitting line instructions between merge and branch instructions.
    auto opcode = i->opcode();
    if (between_merge_and_branch && i->IsLineInst()) {
      return;
    }
    if (last_line_inst != nullptr) {
      // If the current instruction is OpLine or DebugLine and it is the same
      // as the last line instruction that is still effective (can be applied
      // to the next instruction), we skip writing the current instruction.
      if (i->IsLine()) {
        uint32_t operand_index = 0;
        if (last_line_inst->WhileEachInOperand(
                [&operand_index, i](const uint32_t* word) {
                  assert(i->NumInOperandWords() > operand_index);
                  return *word == i->GetSingleWordInOperand(operand_index++);
                })) {
          return;
        }
      } else if (!i->IsNoLine() && i->dbg_line_insts().empty()) {
        // If the current instruction does not have the line information,
        // the last line information is not effective any more. Emit OpNoLine
        // or DebugNoLine to specify it.
        uint32_t shader_set_id = context()
                                     ->get_feature_mgr()
                                     ->GetExtInstImportId_Shader100DebugInfo();
        if (shader_set_id != 0) {
          binary->push_back((5 << 16) |
                            static_cast<uint16_t>(spv::Op::OpExtInst));
          binary->push_back(context()->get_type_mgr()->GetVoidTypeId());
          binary->push_back(context()->TakeNextId());
          binary->push_back(shader_set_id);
          binary->push_back(NonSemanticShaderDebugInfo100DebugNoLine);
        } else {
          binary->push_back((1 << 16) |
                            static_cast<uint16_t>(spv::Op::OpNoLine));
        }
        last_line_inst = nullptr;
      }
    }

    if (opcode == spv::Op::OpLabel) {
      between_label_and_phi_var = true;
    } else if (opcode != spv::Op::OpVariable && opcode != spv::Op::OpPhi &&
               !spvtools::opt::IsOpLineInst(opcode)) {
      between_label_and_phi_var = false;
    }

    if (!(skip_nop && i->IsNop())) {
      const auto& scope = i->GetDebugScope();
      if (scope != last_scope && !between_merge_and_branch) {
        // Can only emit nonsemantic instructions after all phi instructions
        // in a block so don't emit scope instructions before phi instructions
        // for NonSemantic.Shader.DebugInfo.100.
        if (!between_label_and_phi_var ||
            context()
                ->get_feature_mgr()
                ->GetExtInstImportId_OpenCL100DebugInfo()) {
          // Emit DebugScope |scope| to |binary|.
          auto dbg_inst = ext_inst_debuginfo_.begin();
          scope.ToBinary(dbg_inst->type_id(), context()->TakeNextId(),
                         dbg_inst->GetSingleWordOperand(2), binary);
        }
        last_scope = scope;
      }

      i->ToBinaryWithoutAttachedDebugInsts(binary);
    }
    // Update the last line instruction.
    between_merge_and_branch = false;
    if (spvOpcodeIsBlockTerminator(opcode) || i->IsNoLine()) {
      last_line_inst = nullptr;
    } else if (opcode == spv::Op::OpLoopMerge ||
               opcode == spv::Op::OpSelectionMerge) {
      between_merge_and_branch = true;
      last_line_inst = nullptr;
    } else if (i->IsLine()) {
      last_line_inst = i;
    }
  };
  ForEachInst(write_inst, true);

  // We create new instructions for DebugScope and DebugNoLine. The bound must
  // be updated.
  binary->data()[bound_idx] = header_.bound;
}